

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcp.hpp
# Opt level: O0

void __thiscall
lcp<dna_bwt<dna_string>,_unsigned_short>::lcp
          (lcp<dna_bwt<dna_string>,_unsigned_short> *this,dna_bwt<dna_string> *bwt)

{
  unsigned_long uVar1;
  bool bVar2;
  int iVar3;
  pointer psVar4;
  reference pvVar5;
  ostream *poVar6;
  reference pvVar7;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *pvVar8;
  void *pvVar9;
  int *piVar10;
  ostream *poVar11;
  dna_bwt<dna_string> *in_RSI;
  vector<sa_leaf,_std::allocator<sa_leaf>_> *in_RDI;
  int i_2;
  int t_1;
  sa_node_t N;
  int perc_1;
  int last_perc_1;
  sa_node_t root_1;
  stack<sa_node,_std::deque<sa_node,_std::allocator<sa_node>_>_> S_1;
  uint64_t nodes;
  vector<sa_node,_std::allocator<sa_node>_> TMP_NODES;
  int i_1;
  int t;
  uint64_t i;
  sa_leaf L;
  int perc;
  int last_perc;
  sa_leaf root;
  stack<sa_leaf,_std::deque<sa_leaf,_std::allocator<sa_leaf>_>_> S;
  vector<sa_leaf,_std::allocator<sa_leaf>_> TMP_LEAVES;
  uint64_t lcp_values;
  uint64_t max_stack;
  uint64_t leaves;
  uint64_t m;
  value_type *in_stack_fffffffffffffc78;
  stack<sa_leaf,_std::deque<sa_leaf,_std::allocator<sa_leaf>_>_> *in_stack_fffffffffffffc80;
  allocator_type *in_stack_fffffffffffffc88;
  dna_bwt<dna_string> *in_stack_fffffffffffffc90;
  size_type in_stack_fffffffffffffc98;
  vector<sa_leaf,_std::allocator<sa_leaf>_> *in_stack_fffffffffffffca0;
  int *local_310;
  undefined6 in_stack_fffffffffffffda0;
  value_type in_stack_fffffffffffffda6;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_stack_fffffffffffffda8;
  sa_node *x;
  vector<sa_leaf,_std::allocator<sa_leaf>_> *TMP_LEAVES_00;
  dna_bwt<dna_string> *this_00;
  int local_210;
  int local_1cc;
  sa_node local_1c8 [2];
  ulong local_140;
  vector<sa_node,_std::allocator<sa_node>_> local_130;
  int local_118;
  int local_114;
  ulong local_110;
  unsigned_long local_108;
  unsigned_long local_100;
  uint64_t local_f8;
  int local_f0;
  int local_ec;
  vector<sa_leaf,_std::allocator<sa_leaf>_> local_78;
  ulong local_60;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *pvVar12;
  vector<sa_node,_std::allocator<sa_node>_> *TMP_NODES_00;
  sa_node *N_00;
  dna_bwt<dna_string> *in_stack_ffffffffffffffc0;
  
  TMP_LEAVES_00 = in_RDI;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x11c417);
  TMP_LEAVES_00[1].super__Vector_base<sa_leaf,_std::allocator<sa_leaf>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  TMP_LEAVES_00[1].super__Vector_base<sa_leaf,_std::allocator<sa_leaf>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00 = (dna_bwt<dna_string> *)
            &TMP_LEAVES_00[1].super__Vector_base<sa_leaf,_std::allocator<sa_leaf>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  *(undefined2 *)
   &TMP_LEAVES_00[1].super__Vector_base<sa_leaf,_std::allocator<sa_leaf>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = 0xffff;
  psVar4 = (pointer)dna_bwt<dna_string>::size(in_RSI);
  TMP_LEAVES_00[1].super__Vector_base<sa_leaf,_std::allocator<sa_leaf>_>._M_impl.
  super__Vector_impl_data._M_start = psVar4;
  psVar4 = TMP_LEAVES_00[1].super__Vector_base<sa_leaf,_std::allocator<sa_leaf>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::allocator<unsigned_short>::allocator((allocator<unsigned_short> *)0x11c481);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)in_stack_fffffffffffffca0,
             in_stack_fffffffffffffc98,(value_type_conflict1 *)in_stack_fffffffffffffc90,
             in_stack_fffffffffffffc88);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator=
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)in_stack_fffffffffffffc90,
             (vector<unsigned_short,_std::allocator<unsigned_short>_> *)in_stack_fffffffffffffc88);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)in_stack_fffffffffffffc90);
  std::allocator<unsigned_short>::~allocator((allocator<unsigned_short> *)0x11c4df);
  pvVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                     ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)in_RDI,0);
  *pvVar5 = 0;
  poVar6 = std::operator<<((ostream *)&std::cout,
                           "\nNow navigating suffix tree leaves of size >= 2 to compute internal LCP values."
                          );
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  N_00 = (sa_node *)0x0;
  TMP_NODES_00 = (vector<sa_node,_std::allocator<sa_node>_> *)0x0;
  pvVar12 = (vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x0;
  local_60 = 1;
  x = (sa_node *)&stack0xffffffffffffff87;
  std::allocator<sa_leaf>::allocator((allocator<sa_leaf> *)0x11c56d);
  std::vector<sa_leaf,_std::allocator<sa_leaf>_>::vector
            (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
             (allocator_type *)in_stack_fffffffffffffc90);
  std::allocator<sa_leaf>::~allocator((allocator<sa_leaf> *)0x11c596);
  std::stack<sa_leaf,std::deque<sa_leaf,std::allocator<sa_leaf>>>::
  stack<std::deque<sa_leaf,std::allocator<sa_leaf>>,void>(in_stack_fffffffffffffc80);
  dna_bwt<dna_string>::first_leaf(in_stack_fffffffffffffc90);
  std::stack<sa_leaf,_std::deque<sa_leaf,_std::allocator<sa_leaf>_>_>::push
            (in_stack_fffffffffffffc80,(value_type *)in_stack_fffffffffffffc78);
  local_ec = -1;
  local_f0 = 0;
  while (bVar2 = std::stack<sa_leaf,_std::deque<sa_leaf,_std::allocator<sa_leaf>_>_>::empty
                           ((stack<sa_leaf,_std::deque<sa_leaf,_std::allocator<sa_leaf>_>_> *)
                            0x11c5f6), ((bVar2 ^ 0xffU) & 1) != 0) {
    pvVar7 = std::stack<sa_leaf,_std::deque<sa_leaf,_std::allocator<sa_leaf>_>_>::top
                       ((stack<sa_leaf,_std::deque<sa_leaf,_std::allocator<sa_leaf>_>_> *)0x11c60e);
    local_108 = (pvVar7->rn).first;
    local_100 = (pvVar7->rn).second;
    local_f8 = pvVar7->depth;
    std::stack<sa_leaf,_std::deque<sa_leaf,_std::allocator<sa_leaf>_>_>::pop
              ((stack<sa_leaf,_std::deque<sa_leaf,_std::allocator<sa_leaf>_>_> *)0x11c63e);
    TMP_NODES_00 = (vector<sa_node,_std::allocator<sa_node>_> *)
                   ((long)&(TMP_NODES_00->super__Vector_base<sa_node,_std::allocator<sa_node>_>).
                           _M_impl.super__Vector_impl_data._M_start + 1);
    in_stack_fffffffffffffda8 = pvVar12;
    pvVar8 = (vector<unsigned_short,_std::allocator<unsigned_short>_> *)
             std::stack<sa_leaf,_std::deque<sa_leaf,_std::allocator<sa_leaf>_>_>::size
                       ((stack<sa_leaf,_std::deque<sa_leaf,_std::allocator<sa_leaf>_>_> *)0x11c65f);
    pvVar12 = in_stack_fffffffffffffda8;
    uVar1 = local_108;
    if (in_stack_fffffffffffffda8 < pvVar8) {
      in_stack_fffffffffffffda8 =
           (vector<unsigned_short,_std::allocator<unsigned_short>_> *)
           std::stack<sa_leaf,_std::deque<sa_leaf,_std::allocator<sa_leaf>_>_>::size
                     ((stack<sa_leaf,_std::deque<sa_leaf,_std::allocator<sa_leaf>_>_> *)0x11c676);
      pvVar12 = in_stack_fffffffffffffda8;
      uVar1 = local_108;
    }
    while (local_110 = uVar1 + 1, local_110 < local_100) {
      in_stack_fffffffffffffda6 = (value_type)local_f8;
      pvVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                         ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)in_RDI,
                          local_110);
      *pvVar5 = in_stack_fffffffffffffda6;
      local_60 = local_60 + 1;
      N_00 = (sa_node *)((long)&N_00->first_TERM + 1);
      uVar1 = local_110;
    }
    N_00 = (sa_node *)((long)&N_00->first_TERM + 1);
    local_114 = 0;
    dna_bwt<dna_string>::next_leaves
              (this_00,psVar4,TMP_LEAVES_00,(int *)in_RDI,(int)((ulong)poVar6 >> 0x20));
    local_118 = local_114;
    while (local_118 = local_118 + -1, -1 < local_118) {
      std::vector<sa_leaf,_std::allocator<sa_leaf>_>::operator[](&local_78,(long)local_118);
      std::stack<sa_leaf,_std::deque<sa_leaf,_std::allocator<sa_leaf>_>_>::push
                (in_stack_fffffffffffffc80,(value_type *)in_stack_fffffffffffffc78);
    }
    local_f0 = (int)((local_60 * 100) /
                    (ulong)in_RDI[1].super__Vector_base<sa_leaf,_std::allocator<sa_leaf>_>._M_impl.
                           super__Vector_impl_data._M_start);
    if (local_ec < local_f0) {
      poVar11 = std::operator<<((ostream *)&std::cout,"LCP: ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_f0);
      poVar11 = std::operator<<(poVar11,"%.");
      std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
      local_ec = local_f0;
    }
  }
  std::stack<sa_leaf,_std::deque<sa_leaf,_std::allocator<sa_leaf>_>_>::~stack
            ((stack<sa_leaf,_std::deque<sa_leaf,_std::allocator<sa_leaf>_>_> *)0x11c93e);
  std::vector<sa_leaf,_std::allocator<sa_leaf>_>::~vector
            ((vector<sa_leaf,_std::allocator<sa_leaf>_> *)in_stack_fffffffffffffc90);
  poVar6 = std::operator<<((ostream *)&std::cout,"Visited leaves cover ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,(ulong)N_00);
  poVar6 = std::operator<<(poVar6,"/");
  poVar6 = (ostream *)
           std::ostream::operator<<
                     (poVar6,(ulong)in_RDI[1].super__Vector_base<sa_leaf,_std::allocator<sa_leaf>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
  poVar6 = std::operator<<(poVar6," input characters.");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<((ostream *)&std::cout,"Computed ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_60);
  poVar6 = std::operator<<(poVar6,"/");
  poVar6 = (ostream *)
           std::ostream::operator<<
                     (poVar6,(ulong)in_RDI[1].super__Vector_base<sa_leaf,_std::allocator<sa_leaf>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
  poVar6 = std::operator<<(poVar6," LCP values.");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<((ostream *)&std::cout,"Max stack size = ");
  pvVar9 = (void *)std::ostream::operator<<(poVar6,(ulong)pvVar12);
  std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<((ostream *)&std::cout,"Processed ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,(ulong)TMP_NODES_00);
  poVar6 = std::operator<<(poVar6," suffix-tree leaves of size >= 2.");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<((ostream *)&std::cout,
                           "\nNow navigating suffix tree nodes to compute remaining LCP values.");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  std::allocator<sa_node>::allocator((allocator<sa_node> *)0x11cbb7);
  std::vector<sa_node,_std::allocator<sa_node>_>::vector
            ((vector<sa_node,_std::allocator<sa_node>_> *)in_stack_fffffffffffffca0,
             in_stack_fffffffffffffc98,(allocator_type *)in_stack_fffffffffffffc90);
  std::allocator<sa_node>::~allocator((allocator<sa_node> *)0x11cbe0);
  local_140 = 0;
  local_310 = (int *)0x0;
  std::stack<sa_node,std::deque<sa_node,std::allocator<sa_node>>>::
  stack<std::deque<sa_node,std::allocator<sa_node>>,void>
            ((stack<sa_node,_std::deque<sa_node,_std::allocator<sa_node>_>_> *)
             in_stack_fffffffffffffc80);
  dna_bwt<dna_string>::root(local_1c8,in_RSI);
  std::stack<sa_node,_std::deque<sa_node,_std::allocator<sa_node>_>_>::push
            ((stack<sa_node,_std::deque<sa_node,_std::allocator<sa_node>_>_> *)
             in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  local_1cc = -1;
  while (bVar2 = std::stack<sa_node,_std::deque<sa_node,_std::allocator<sa_node>_>_>::empty
                           ((stack<sa_node,_std::deque<sa_node,_std::allocator<sa_node>_>_> *)
                            0x11cc5e), ((bVar2 ^ 0xffU) & 1) != 0) {
    piVar10 = (int *)std::stack<sa_node,_std::deque<sa_node,_std::allocator<sa_node>_>_>::size
                               ((stack<sa_node,_std::deque<sa_node,_std::allocator<sa_node>_>_> *)
                                0x11cc76);
    if (local_310 < piVar10) {
      local_310 = (int *)std::stack<sa_node,_std::deque<sa_node,_std::allocator<sa_node>_>_>::size
                                   ((stack<sa_node,_std::deque<sa_node,_std::allocator<sa_node>_>_>
                                     *)0x11cc8d);
    }
    std::stack<sa_node,_std::deque<sa_node,_std::allocator<sa_node>_>_>::top
              ((stack<sa_node,_std::deque<sa_node,_std::allocator<sa_node>_>_> *)0x11ccc0);
    std::stack<sa_node,_std::deque<sa_node,_std::allocator<sa_node>_>_>::pop
              ((stack<sa_node,_std::deque<sa_node,_std::allocator<sa_node>_>_> *)0x11ccf9);
    local_140 = local_140 + 1;
    update_lcp<unsigned_short>
              (x,in_stack_fffffffffffffda8,
               (uint64_t *)CONCAT26(in_stack_fffffffffffffda6,in_stack_fffffffffffffda0));
    dna_bwt<dna_string>::next_nodes(in_stack_ffffffffffffffc0,N_00,TMP_NODES_00,local_310);
    for (local_210 = -1; -1 < local_210; local_210 = local_210 + -1) {
      std::vector<sa_node,_std::allocator<sa_node>_>::operator[](&local_130,(long)local_210);
      std::stack<sa_node,_std::deque<sa_node,_std::allocator<sa_node>_>_>::push
                ((stack<sa_node,_std::deque<sa_node,_std::allocator<sa_node>_>_> *)
                 in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
    }
    iVar3 = (int)((local_60 * 100) /
                 (ulong)in_RDI[1].super__Vector_base<sa_leaf,_std::allocator<sa_leaf>_>._M_impl.
                        super__Vector_impl_data._M_start);
    if (local_1cc < iVar3) {
      poVar6 = std::operator<<((ostream *)&std::cout,"LCP: ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar3);
      poVar6 = std::operator<<(poVar6,"%.");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      local_1cc = iVar3;
    }
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"Computed ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_60);
  poVar6 = std::operator<<(poVar6,"/");
  poVar6 = (ostream *)
           std::ostream::operator<<
                     (poVar6,(ulong)in_RDI[1].super__Vector_base<sa_leaf,_std::allocator<sa_leaf>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
  poVar6 = std::operator<<(poVar6," LCP values.");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<((ostream *)&std::cout,"Max stack size = ");
  pvVar9 = (void *)std::ostream::operator<<(poVar6,(ulong)local_310);
  std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<((ostream *)&std::cout,"Processed ");
  poVar11 = (ostream *)std::ostream::operator<<(poVar6,local_140);
  poVar11 = std::operator<<(poVar11," suffix-tree nodes.");
  std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
  std::stack<sa_node,_std::deque<sa_node,_std::allocator<sa_node>_>_>::~stack
            ((stack<sa_node,_std::deque<sa_node,_std::allocator<sa_node>_>_> *)0x11d011);
  std::vector<sa_node,_std::allocator<sa_node>_>::~vector
            ((vector<sa_node,_std::allocator<sa_node>_> *)poVar6);
  return;
}

Assistant:

lcp(bwt_t * bwt){

		this->bwt;

		n = bwt->size();

		LCP = vector<lcp_int_t>(n, nil);
		LCP[0] = 0;

		/*
		 * FIRST PASS: LEAVES NAVIGATION. COMPUTE LCP VALUES INSIDE SUFFIX TREE LEAVES.
		 */

		cout << "\nNow navigating suffix tree leaves of size >= 2 to compute internal LCP values." << endl;

		uint64_t m = 0;//portion of text covered by visited leaves
		uint64_t leaves = 0;//number of visited leaves
		uint64_t max_stack = 0;
		uint64_t lcp_values = 1;//number of filled LCP values

		{

			auto TMP_LEAVES = vector<sa_leaf>(5);

			stack<sa_leaf> S;

			sa_leaf root = bwt->first_leaf();
			S.push(root);

			int last_perc = -1;
			int perc = 0;

			while(not S.empty()){

				sa_leaf L = S.top();
				S.pop();
				leaves++;

				max_stack = S.size() > max_stack ? S.size() : max_stack;

				assert(L.rn.second > L.rn.first);

				for(uint64_t i = L.rn.first+1; i<L.rn.second; ++i){

					assert(LCP[i]==nil);

					LCP[i] = L.depth;

					lcp_values++;
					m++;

				}

				m++;

				assert(m<=n);

				int t = 0;

				bwt->next_leaves(L, TMP_LEAVES, t, 2);

				for(int i=t-1;i>=0;--i) S.push(TMP_LEAVES[i]);

				perc = (100*lcp_values)/n;

				if(perc > last_perc){

					cout << "LCP: " << perc << "%." << endl;
					last_perc = perc;

				}

			}
		}

		cout << "Visited leaves cover " << m << "/" << n << " input characters." << endl;
		cout << "Computed " << lcp_values << "/" << n << " LCP values." << endl;

		cout << "Max stack size = " << max_stack << endl;
		cout << "Processed " << leaves << " suffix-tree leaves of size >= 2." << endl;

		cout << "\nNow navigating suffix tree nodes to compute remaining LCP values." << endl;

		{

			auto TMP_NODES = vector<typename bwt_t::sa_node_t>(5);

			uint64_t nodes = 0;//visited ST nodes
			max_stack = 0;

			stack<typename bwt_t::sa_node_t> S;

			typename bwt_t::sa_node_t root = bwt->root();

			S.push(root);

			int last_perc = -1;
			int perc = 0;

			while(not S.empty()){

				max_stack = S.size() > max_stack ? S.size() : max_stack;

				typename bwt_t::sa_node_t N = S.top();
				S.pop();
				nodes++;

				update_lcp<lcp_int_t>(N,LCP,lcp_values);

				int t = 0;

				bwt->next_nodes(N, TMP_NODES, t);

				for(int i=t-1;i>=0;--i){

					S.push(TMP_NODES[i]);

				}

				perc = (100*lcp_values)/n;

				if(perc > last_perc){

					cout << "LCP: " << perc << "%." << endl;
					last_perc = perc;

				}

			}

			cout << "Computed " << lcp_values << "/" << n << " LCP values." << endl;
			cout << "Max stack size = " << max_stack << endl;
			cout << "Processed " << nodes << " suffix-tree nodes." << endl;

		}


	}